

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteU32Leb128WithReloc
          (BinaryWriter *this,Index index,char *desc,RelocType reloc_type)

{
  pointer *ppRVar1;
  Index IVar2;
  char *pcVar3;
  pointer pRVar4;
  undefined1 *puVar5;
  pointer pRVar6;
  pointer pRVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  pointer pSVar11;
  long lVar12;
  pointer pRVar13;
  pointer pRVar14;
  pointer pSVar15;
  pointer pRVar16;
  undefined4 uVar17;
  mapped_type mVar18;
  ulong uVar19;
  ulong uVar20;
  unsigned_long local_88;
  size_t offset;
  key_type local_78;
  RelocType local_54;
  char *local_50;
  ulong local_48;
  pointer local_40;
  Index local_34;
  
  if (this->options_->relocatable != true) {
    WriteU32Leb128(this->stream_,index,desc);
    return;
  }
  local_54 = reloc_type;
  if ((this->current_reloc_section_ == (RelocSection *)0x0) ||
     (this->current_reloc_section_->section_index != this->section_count_)) {
    local_34 = index;
    if (0xb < (long)(int)this->last_section_type_) {
      __assert_fail("static_cast<int>(sec) < kBinarySectionCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary.h"
                    ,0x4d,"const char *wabt::GetSectionName(BinarySection)");
    }
    pcVar3 = *(char **)(g_section_name + (long)(int)this->last_section_type_ * 8);
    pRVar13 = (this->reloc_sections_).
              super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar13 ==
        (this->reloc_sections_).
        super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pRVar16 = (this->reloc_sections_).
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pRVar13 - (long)pRVar16 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar12 = (long)pRVar13 - (long)pRVar16 >> 3;
      uVar19 = lVar12 * -0x3333333333333333;
      uVar10 = 1;
      if (pRVar13 != pRVar16) {
        uVar10 = uVar19;
      }
      local_48 = uVar10 + uVar19;
      if (0x333333333333332 < local_48) {
        local_48 = 0x333333333333333;
      }
      if (CARRY8(uVar10,uVar19)) {
        local_48 = 0x333333333333333;
      }
      local_50 = desc;
      if (local_48 == 0) {
        pRVar6 = (pointer)0x0;
      }
      else {
        local_40 = pRVar16;
        pRVar6 = (pointer)operator_new(local_48 * 0x28);
        pRVar16 = local_40;
      }
      IVar2 = this->section_count_;
      (&pRVar6->name)[lVar12] = pcVar3;
      (&pRVar6->section_index)[lVar12 * 2] = IVar2;
      ppRVar1 = &(pRVar6->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar12;
      *ppRVar1 = (pointer)0x0;
      ppRVar1[1] = (pointer)0x0;
      (&(pRVar6->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)[lVar12] = (pointer)0x0;
      pRVar14 = pRVar6;
      for (pRVar7 = pRVar16; pRVar13 != pRVar7; pRVar7 = pRVar7 + 1) {
        pRVar14->section_index = pRVar7->section_index;
        pRVar14->name = pRVar7->name;
        pRVar4 = (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (pRVar14->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (pRVar14->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_finish = pRVar4;
        (pRVar14->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pRVar14 = pRVar14 + 1;
      }
      if (pRVar16 != (pointer)0x0) {
        operator_delete(pRVar16);
      }
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar6;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar14 + 1;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar6 + local_48;
      desc = local_50;
    }
    else {
      IVar2 = this->section_count_;
      pRVar13->name = pcVar3;
      pRVar13->section_index = IVar2;
      (pRVar13->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pRVar13->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pRVar13->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar14 = (this->reloc_sections_).
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar14 + 1;
    }
    this->current_reloc_section_ = pRVar14;
    index = local_34;
  }
  local_88 = this->stream_->offset_ - this->last_section_payload_offset_;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if (reloc_type == First) {
    uVar17 = 0;
    std::__cxx11::string::_M_assign
              ((string *)&local_78,
               (string *)
               (this->module_->funcs).
               super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
               super__Vector_impl_data._M_start[index]);
  }
  else {
    uVar17 = 2;
    std::__cxx11::string::_M_assign
              ((string *)&local_78,
               (string *)
               (this->module_->globals).
               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
               super__Vector_impl_data._M_start[index]);
  }
  iVar8 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->symtab_)._M_h,&local_78);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_48 = CONCAT44(local_48._4_4_,uVar17);
    pSVar11 = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pSVar15 = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_50 = desc;
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->symtab_,&local_78);
    mVar18 = (int)((ulong)((long)pSVar11 - (long)pSVar15) >> 2) * -0x55555555;
    *pmVar9 = mVar18;
    pSVar11 = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar11 ==
        (this->symbols_).
        super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pSVar15 = (this->symbols_).
                super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar13 = (pointer)((long)pSVar11 - (long)pSVar15);
      local_34 = index;
      if (pRVar13 == (pointer)0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar12 = (long)pRVar13 >> 2;
      uVar19 = lVar12 * -0x5555555555555555;
      uVar10 = 1;
      if (pSVar11 != pSVar15) {
        uVar10 = uVar19;
      }
      uVar20 = uVar10 + uVar19;
      if (0xaaaaaaaaaaaaaa9 < uVar20) {
        uVar20 = 0xaaaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar10,uVar19)) {
        uVar20 = 0xaaaaaaaaaaaaaaa;
      }
      local_40 = pRVar13;
      if (uVar20 == 0) {
        pSVar11 = (pointer)0x0;
      }
      else {
        offset = (size_t)pSVar15;
        pSVar11 = (pointer)operator_new(uVar20 * 0xc);
        pSVar15 = (pointer)offset;
      }
      (&pSVar11->symbol_index)[lVar12] = mVar18;
      (&pSVar11->type)[lVar12] = (SymbolType)local_48;
      (&pSVar11->element_index)[lVar12] = local_34;
      if (0 < (long)local_40) {
        memmove(pSVar11,pSVar15,(size_t)local_40);
      }
      puVar5 = &local_40->field_0xc;
      if (pSVar15 != (pointer)0x0) {
        operator_delete(pSVar15);
      }
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar11;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(puVar5 + (long)&pSVar11->symbol_index);
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar11 + uVar20;
      desc = local_50;
      index = local_34;
    }
    else {
      pSVar11->symbol_index = mVar18;
      pSVar11->type = (SymbolType)local_48;
      pSVar11->element_index = index;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar11 + 1;
      desc = local_50;
    }
  }
  else {
    mVar18 = *(mapped_type *)
              ((long)iVar8.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                     ._M_cur + 0x28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_78._M_dataplus._M_p._0_4_ = mVar18;
  std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
  emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
            ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
             &this->current_reloc_section_->relocations,&local_54,&local_88,(uint *)&local_78);
  WriteFixedU32Leb128(this->stream_,index,desc);
  return;
}

Assistant:

void BinaryWriter::WriteU32Leb128WithReloc(Index index,
                                           const char* desc,
                                           RelocType reloc_type) {
  if (options_.relocatable) {
    AddReloc(reloc_type, index);
    WriteFixedU32Leb128(stream_, index, desc);
  } else {
    WriteU32Leb128(stream_, index, desc);
  }
}